

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  undefined1 *local_160;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [32];
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [32];
  undefined1 local_40 [8];
  string shader_source;
  size_t max_dimension_index;
  TestShaderType tested_shader_type_local;
  SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  for (shader_source.field_2._8_8_ = 1; (ulong)shader_source.field_2._8_8_ < 9;
      shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
    std::__cxx11::string::string((string *)local_40,(string *)shader_start_abi_cxx11_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_80,"    float",&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b8,"[2]",&local_b9);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_60,this,local_80,local_b8,shader_source.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_40,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_100," x",&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_128,"[2]",(allocator<char> *)((long)&cs + 7));
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_e0,this,local_100,local_128,8 - shader_source.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_40,local_e0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cs + 7));
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    std::__cxx11::string::operator+=((string *)local_40,";\n");
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::operator+=((string *)local_40,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
      std::__cxx11::string::operator+=((string *)local_40,(string *)emit_quad_abi_cxx11_);
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::operator+=((string *)local_40,(string *)set_tesseation_abi_cxx11_);
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x5d7);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)local_40,(string *)shader_end_abi_cxx11_);
    tcs = (string *)default_vertex_shader_source_abi_cxx11_;
    local_160 = default_fragment_shader_source_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      local_160 = local_40;
      break;
    case VERTEX_SHADER_TYPE:
      tcs = (string *)local_40;
      break;
    case COMPUTE_SHADER_TYPE:
      tcs = (string *)empty_string_abi_cxx11_;
      local_160 = empty_string_abi_cxx11_;
      break;
    case GEOMETRY_SHADER_TYPE:
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x5da);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[9])(this,tcs,local_160,1,0);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void SizedDeclarationsTypenameStyle1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string shader_source = shader_start;

		shader_source += this->extend_string("    float", "[2]", max_dimension_index);
		shader_source += this->extend_string(" x", "[2]", API::MAX_ARRAY_DIMENSIONS - max_dimension_index);
		shader_source += ";\n";

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}